

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.cpp
# Opt level: O3

stref idx2::GetExtension(stref *Path)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  stref sVar4;
  
  lVar2 = (long)Path->Size + -1;
  iVar1 = (int)lVar2;
  if ((long)Path->Size == 0) {
LAB_0010c030:
    if (lVar2 != -1) {
      sVar4 = SubString(Path,(int)lVar2 + 1,iVar1 - (int)lVar2);
      return sVar4;
    }
  }
  else {
    do {
      if ((Path->field_0).Ptr[lVar2] == '.') goto LAB_0010c030;
      bVar3 = lVar2 != 0;
      lVar2 = lVar2 + -1;
    } while (bVar3);
  }
  return (stref)ZEXT816(0);
}

Assistant:

stref
GetExtension(const stref& Path)
{
  cstr LastDot = FindLast(RevBegin(Path), RevEnd(Path), '.');
  if (LastDot == RevEnd(Path))
    return stref();

  return SubString(Path, int(LastDot + 1 - Begin(Path)), int(End(Path) - 1 - LastDot));
}